

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void doWarehouseStuff(IClientConnector *clientConnector)

{
  ostream *poVar1;
  _Alloc_hider _Var2;
  WareHouseClient appClient;
  vector<Product,_std::allocator<Product>_> all;
  Product p;
  Product p2;
  JsonRpcClient client;
  allocator<char> local_149;
  WareHouseClient local_148;
  string local_140;
  Product local_120;
  undefined1 local_d0 [80];
  JsonRpcClient local_80;
  Product local_68;
  
  local_148.client = &local_80;
  local_80._vptr_JsonRpcClient = (_func_int **)&PTR__JsonRpcClient_0016c2b0;
  local_120.id._M_dataplus._M_p = (pointer)&local_120.id.field_2;
  local_120.id._M_string_length = 0;
  local_80.v = v2;
  local_120.id.field_2._M_local_buf[0] = '\0';
  local_120.price = 0.0;
  local_120.name._M_dataplus._M_p = (pointer)&local_120.name.field_2;
  local_120.name._M_string_length = 0;
  local_120.name.field_2._M_local_buf[0] = '\0';
  local_120.cat = order;
  local_80.connector = clientConnector;
  std::__cxx11::string::assign((char *)&local_120);
  local_120.price = 22.4;
  std::__cxx11::string::assign((char *)&local_120.name);
  local_120.cat = cash_carry;
  poVar1 = std::operator<<((ostream *)&std::cout,"Adding product: ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) | 1;
  WareHouseClient::AddProduct(&local_148,&local_120);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"0xff",&local_149);
  WareHouseClient::GetProduct((Product *)local_d0,&local_148,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  poVar1 = std::operator<<((ostream *)&std::cout,"Found product: ");
  poVar1 = std::operator<<(poVar1,(string *)(local_d0 + 0x28));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"0xff2",&local_149);
  WareHouseClient::GetProduct(&local_68,&local_148,&local_140);
  Product::~Product(&local_68);
  std::__cxx11::string::~string((string *)&local_140);
  WareHouseClient::AllProducts((vector<Product,_std::allocator<Product>_> *)&local_140,&local_148);
  for (_Var2._M_p = local_140._M_dataplus._M_p; _Var2._M_p != (pointer)local_140._M_string_length;
      _Var2._M_p = _Var2._M_p + 0x50) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)(_Var2._M_p + 0x28));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::vector<Product,_std::allocator<Product>_>::~vector
            ((vector<Product,_std::allocator<Product>_> *)&local_140);
  Product::~Product((Product *)local_d0);
  Product::~Product(&local_120);
  return;
}

Assistant:

void doWarehouseStuff(IClientConnector &clientConnector) {
  JsonRpcClient client(clientConnector, version::v2);
  WareHouseClient appClient(client);
  Product p;
  p.id = "0xff";
  p.price = 22.4;
  p.name = "Product 1";
  p.cat = category::cash_carry;
  cout << "Adding product: " << std::boolalpha << appClient.AddProduct(p) << "\n";

  Product p2 = appClient.GetProduct("0xff");
  cout << "Found product: " << p2.name << "\n";
  try {
    appClient.GetProduct("0xff2");
  } catch (JsonRpcException &e) {
    cerr << "Error finding product: " << e.what() << "\n";
  }

  auto all = appClient.AllProducts();
  for (const auto &p: all) {
    cout << p.name << endl;
  }
}